

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

int __thiscall CharFieldSourceString::arraylen(CharFieldSourceString *this,CVmPackType *t)

{
  wchar_t wVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  
  wVar1 = t->type_code;
  if ((uint)(wVar1 + L'\xffffff9f') < 2) {
LAB_0029bc96:
    sVar3 = utf8_ptr::len(&this->p,this->len);
    return (int)sVar3;
  }
  if (wVar1 == L'w') {
LAB_0029bcca:
    iVar2 = t->count_in_bytes;
    sVar3 = utf8_ptr::len(&this->p,this->len);
    iVar2 = (int)sVar3 << (iVar2 != 0);
  }
  else {
    if (wVar1 == L'H') {
LAB_0029bca5:
      iVar2 = t->count_in_bytes;
      sVar3 = utf8_ptr::len(&this->p,this->len);
      uVar4 = sVar3 + 1 >> 1;
      if (iVar2 == 0) {
        uVar4 = sVar3;
      }
      return (int)uVar4;
    }
    if (wVar1 != L'U') {
      if (wVar1 == L'W') goto LAB_0029bcca;
      if (wVar1 == L'h') goto LAB_0029bca5;
      if (wVar1 != L'u') {
        if (wVar1 != L'A') {
          return 0;
        }
        goto LAB_0029bc96;
      }
    }
    iVar2 = (int)this->len;
  }
  return iVar2;
}

Assistant:

virtual int arraylen(CVmPackType *t)
    {
        switch (t->type_code)
        {
        case 'a':
        case 'A':
        case 'b':
            /* the length is in bytes, and we write one byte per character */
            return p.len(len);

        case 'w':
        case 'W':
            /* 
             *   the default length is in characters; if counting in bytes,
             *   we need two bytes per character 
             */
            return (t->count_in_bytes ? 2 : 1) * p.len(len);
            
        case 'h':
        case 'H':
            /* 
             *   the length is in source nibbles, one nibble per character;
             *   in bytes, we need half as many bytes as characters, rounded
             *   up 
             */
            return t->count_in_bytes ? (p.len(len)+1)/2 : p.len(len);

        case 'u':
        case 'U':
            /* 
             *   the length is in bytes, in UTF-8 format; this is the same
             *   format as our underlying string, so we can simply return its
             *   byte length 
             */
            return len;

        default:
            return 0;
        }
    }